

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O1

UBool isNormInert(BinaryProperty *param_1,UChar32 c,UProperty which)

{
  uint in_EAX;
  int iVar1;
  Normalizer2 *pNVar2;
  bool bVar3;
  UErrorCode errorCode;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  pNVar2 = icu_63::Normalizer2Factory::getInstance
                     (which - 0x23,(UErrorCode *)((long)&uStack_18 + 4));
  if (uStack_18._4_4_ < 1) {
    iVar1 = (*(pNVar2->super_UObject)._vptr_UObject[0x11])(pNVar2,c);
    bVar3 = (char)iVar1 != '\0';
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static UBool isNormInert(const BinaryProperty &/*prop*/, UChar32 c, UProperty which) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *norm2=Normalizer2Factory::getInstance(
        (UNormalizationMode)(which-UCHAR_NFD_INERT+UNORM_NFD), errorCode);
    return U_SUCCESS(errorCode) && norm2->isInert(c);
}